

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

bool __thiscall
btQuantizedBvh::serialize
          (btQuantizedBvh *this,void *o_alignedDataBuffer,uint param_3,bool i_swapEndian)

{
  int iVar1;
  byte bVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  btQuantizedBvhNode *pbVar6;
  btOptimizedBvhNode *pbVar7;
  btOptimizedBvhNode *pbVar8;
  btBvhSubtreeInfo *pbVar9;
  byte in_CL;
  undefined8 *in_RSI;
  long in_RDI;
  int i_1;
  int i;
  int nodeIndex_3;
  int nodeIndex_2;
  int nodeIndex_1;
  int nodeIndex;
  int nodeCount;
  uint sizeToAdd;
  uchar *nodeData;
  btQuantizedBvh *targetBvh;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  unsigned_short in_stack_ffffffffffffff1c;
  unsigned_short in_stack_ffffffffffffff1e;
  unsigned_short in_stack_ffffffffffffff20;
  unsigned_short in_stack_ffffffffffffff22;
  unsigned_short in_stack_ffffffffffffff24;
  unsigned_short in_stack_ffffffffffffff26;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  
  bVar2 = in_CL & 1;
  iVar4 = btAlignedObjectArray<btBvhSubtreeInfo>::size
                    ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0));
  *(int *)(in_RDI + 0xf0) = iVar4;
  operator_new(0xf8,in_RSI);
  btQuantizedBvh((btQuantizedBvh *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (bVar2 == 0) {
    *(undefined4 *)((long)in_RSI + 0x3c) = *(undefined4 *)(in_RDI + 0x3c);
    in_RSI[1] = *(undefined8 *)(in_RDI + 8);
    in_RSI[2] = *(undefined8 *)(in_RDI + 0x10);
    in_RSI[3] = *(undefined8 *)(in_RDI + 0x18);
    in_RSI[4] = *(undefined8 *)(in_RDI + 0x20);
    in_RSI[5] = *(undefined8 *)(in_RDI + 0x28);
    in_RSI[6] = *(undefined8 *)(in_RDI + 0x30);
    *(undefined4 *)(in_RSI + 0x19) = *(undefined4 *)(in_RDI + 200);
    *(undefined4 *)(in_RSI + 0x1e) = *(undefined4 *)(in_RDI + 0xf0);
  }
  else {
    uVar5 = btSwapEndian(0);
    *(uint *)((long)in_RSI + 0x3c) = uVar5;
    btSwapVector3Endian((btVector3 *)
                        CONCAT26(in_stack_ffffffffffffff26,
                                 CONCAT24(in_stack_ffffffffffffff24,
                                          CONCAT22(in_stack_ffffffffffffff22,
                                                   in_stack_ffffffffffffff20))),
                        (btVector3 *)
                        CONCAT26(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)));
    btSwapVector3Endian((btVector3 *)
                        CONCAT26(in_stack_ffffffffffffff26,
                                 CONCAT24(in_stack_ffffffffffffff24,
                                          CONCAT22(in_stack_ffffffffffffff22,
                                                   in_stack_ffffffffffffff20))),
                        (btVector3 *)
                        CONCAT26(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)));
    btSwapVector3Endian((btVector3 *)
                        CONCAT26(in_stack_ffffffffffffff26,
                                 CONCAT24(in_stack_ffffffffffffff24,
                                          CONCAT22(in_stack_ffffffffffffff22,
                                                   in_stack_ffffffffffffff20))),
                        (btVector3 *)
                        CONCAT26(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)));
    uVar5 = btSwapEndian(0);
    *(uint *)(in_RSI + 0x19) = uVar5;
    uVar5 = btSwapEndian(0);
    *(uint *)(in_RSI + 0x1e) = uVar5;
  }
  *(byte *)(in_RSI + 8) = *(byte *)(in_RDI + 0x40) & 1;
  iVar4 = *(int *)(in_RDI + 0x3c);
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    btAlignedObjectArray<btOptimizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btOptimizedBvhNode> *)
               CONCAT26(in_stack_ffffffffffffff26,
                        CONCAT24(in_stack_ffffffffffffff24,
                                 CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
               (void *)CONCAT26(in_stack_ffffffffffffff1e,
                                CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
               in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    if (bVar2 == 0) {
      for (local_50 = 0; local_50 < iVar4; local_50 = local_50 + 1) {
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_50);
        pbVar8 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_50);
        *(undefined8 *)(pbVar8->m_aabbMinOrg).m_floats =
             *(undefined8 *)(pbVar7->m_aabbMinOrg).m_floats;
        *(undefined8 *)((pbVar8->m_aabbMinOrg).m_floats + 2) =
             *(undefined8 *)((pbVar7->m_aabbMinOrg).m_floats + 2);
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_50);
        pbVar8 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_50);
        *(undefined8 *)(pbVar8->m_aabbMaxOrg).m_floats =
             *(undefined8 *)(pbVar7->m_aabbMaxOrg).m_floats;
        *(undefined8 *)((pbVar8->m_aabbMaxOrg).m_floats + 2) =
             *(undefined8 *)((pbVar7->m_aabbMaxOrg).m_floats + 2);
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_50);
        iVar1 = pbVar7->m_escapeIndex;
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_50);
        pbVar7->m_escapeIndex = iVar1;
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_50);
        iVar1 = pbVar7->m_subPart;
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_50);
        pbVar7->m_subPart = iVar1;
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_50);
        iVar1 = pbVar7->m_triangleIndex;
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_50);
        pbVar7->m_triangleIndex = iVar1;
      }
    }
    else {
      for (local_4c = 0; local_4c < iVar4; local_4c = local_4c + 1) {
        btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_4c);
        btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_4c);
        btSwapVector3Endian((btVector3 *)
                            CONCAT26(in_stack_ffffffffffffff26,
                                     CONCAT24(in_stack_ffffffffffffff24,
                                              CONCAT22(in_stack_ffffffffffffff22,
                                                       in_stack_ffffffffffffff20))),
                            (btVector3 *)
                            CONCAT26(in_stack_ffffffffffffff1e,
                                     CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)))
        ;
        btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_4c);
        btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_4c);
        btSwapVector3Endian((btVector3 *)
                            CONCAT26(in_stack_ffffffffffffff26,
                                     CONCAT24(in_stack_ffffffffffffff24,
                                              CONCAT22(in_stack_ffffffffffffff22,
                                                       in_stack_ffffffffffffff20))),
                            (btVector3 *)
                            CONCAT26(in_stack_ffffffffffffff1e,
                                     CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)))
        ;
        btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_4c);
        uVar5 = btSwapEndian(0);
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_4c);
        pbVar7->m_escapeIndex = uVar5;
        btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_4c);
        uVar5 = btSwapEndian(0);
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_4c);
        pbVar7->m_subPart = uVar5;
        btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_4c);
        uVar5 = btSwapEndian(0);
        pbVar7 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RSI + 0xd),local_4c);
        pbVar7->m_triangleIndex = uVar5;
      }
    }
    btAlignedObjectArray<btOptimizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btOptimizedBvhNode> *)
               CONCAT26(in_stack_ffffffffffffff26,
                        CONCAT24(in_stack_ffffffffffffff24,
                                 CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
               (void *)CONCAT26(in_stack_ffffffffffffff1e,
                                CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
               in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  }
  else {
    btAlignedObjectArray<btQuantizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btQuantizedBvhNode> *)
               CONCAT26(in_stack_ffffffffffffff26,
                        CONCAT24(in_stack_ffffffffffffff24,
                                 CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
               (void *)CONCAT26(in_stack_ffffffffffffff1e,
                                CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
               in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    if (bVar2 == 0) {
      for (local_48 = 0; local_48 < iVar4; local_48 = local_48 + 1) {
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_48);
        uVar3 = pbVar6->m_quantizedAabbMin[0];
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_48);
        pbVar6->m_quantizedAabbMin[0] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_48);
        uVar3 = pbVar6->m_quantizedAabbMin[1];
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_48);
        pbVar6->m_quantizedAabbMin[1] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_48);
        uVar3 = pbVar6->m_quantizedAabbMin[2];
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_48);
        pbVar6->m_quantizedAabbMin[2] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_48);
        uVar3 = pbVar6->m_quantizedAabbMax[0];
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_48);
        pbVar6->m_quantizedAabbMax[0] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_48);
        uVar3 = pbVar6->m_quantizedAabbMax[1];
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_48);
        pbVar6->m_quantizedAabbMax[1] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_48);
        uVar3 = pbVar6->m_quantizedAabbMax[2];
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_48);
        pbVar6->m_quantizedAabbMax[2] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_48);
        iVar1 = pbVar6->m_escapeIndexOrTriangleIndex;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_48);
        pbVar6->m_escapeIndexOrTriangleIndex = iVar1;
      }
    }
    else {
      for (local_44 = 0; local_44 < iVar4; local_44 = local_44 + 1) {
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_44);
        uVar3 = btSwapEndian(pbVar6->m_quantizedAabbMin[0]);
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_44);
        pbVar6->m_quantizedAabbMin[0] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_44);
        uVar3 = btSwapEndian(pbVar6->m_quantizedAabbMin[1]);
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_44);
        pbVar6->m_quantizedAabbMin[1] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_44);
        uVar3 = btSwapEndian(pbVar6->m_quantizedAabbMin[2]);
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_44);
        pbVar6->m_quantizedAabbMin[2] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_44);
        uVar3 = btSwapEndian(pbVar6->m_quantizedAabbMax[0]);
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_44);
        pbVar6->m_quantizedAabbMax[0] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_44);
        uVar3 = btSwapEndian(pbVar6->m_quantizedAabbMax[1]);
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_44);
        pbVar6->m_quantizedAabbMax[1] = uVar3;
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_44);
        uVar3 = btSwapEndian(pbVar6->m_quantizedAabbMax[2]);
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_44);
        pbVar6->m_quantizedAabbMax[2] = uVar3;
        btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                  ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_44);
        uVar5 = btSwapEndian(0);
        pbVar6 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RSI + 0x15),local_44);
        pbVar6->m_escapeIndexOrTriangleIndex = uVar5;
      }
    }
    btAlignedObjectArray<btQuantizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btQuantizedBvhNode> *)
               CONCAT26(in_stack_ffffffffffffff26,
                        CONCAT24(in_stack_ffffffffffffff24,
                                 CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
               (void *)CONCAT26(in_stack_ffffffffffffff1e,
                                CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
               in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  }
  btAlignedObjectArray<btBvhSubtreeInfo>::initializeFromBuffer
            ((btAlignedObjectArray<btBvhSubtreeInfo> *)
             CONCAT26(in_stack_ffffffffffffff26,
                      CONCAT24(in_stack_ffffffffffffff24,
                               CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (void *)CONCAT26(in_stack_ffffffffffffff1e,
                              CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
             in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  if (bVar2 == 0) {
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0xf0); local_58 = local_58 + 1) {
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      uVar3 = pbVar9->m_quantizedAabbMin[0];
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_quantizedAabbMin[0] = uVar3;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      uVar3 = pbVar9->m_quantizedAabbMin[1];
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_quantizedAabbMin[1] = uVar3;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      uVar3 = pbVar9->m_quantizedAabbMin[2];
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_quantizedAabbMin[2] = uVar3;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      uVar3 = pbVar9->m_quantizedAabbMax[0];
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_quantizedAabbMax[0] = uVar3;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      uVar3 = pbVar9->m_quantizedAabbMax[1];
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_quantizedAabbMax[1] = uVar3;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      in_stack_ffffffffffffff10 = CONCAT22(pbVar9->m_quantizedAabbMax[2],uVar3);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_quantizedAabbMax[2] = (unsigned_short)((uint)in_stack_ffffffffffffff10 >> 0x10);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      in_stack_ffffffffffffff14 = pbVar9->m_rootNodeIndex;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_rootNodeIndex = in_stack_ffffffffffffff14;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_58);
      in_stack_ffffffffffffff18 = pbVar9->m_subtreeSize;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_subtreeSize = in_stack_ffffffffffffff18;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_padding[0] = 0;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_padding[1] = 0;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_58);
      pbVar9->m_padding[2] = 0;
    }
  }
  else {
    for (local_54 = 0; local_54 < *(int *)(in_RDI + 0xf0); local_54 = local_54 + 1) {
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      in_stack_ffffffffffffff1c = btSwapEndian(pbVar9->m_quantizedAabbMin[0]);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_quantizedAabbMin[0] = in_stack_ffffffffffffff1c;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      in_stack_ffffffffffffff1e = btSwapEndian(pbVar9->m_quantizedAabbMin[1]);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_quantizedAabbMin[1] = in_stack_ffffffffffffff1e;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      in_stack_ffffffffffffff20 = btSwapEndian(pbVar9->m_quantizedAabbMin[2]);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_quantizedAabbMin[2] = in_stack_ffffffffffffff20;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      in_stack_ffffffffffffff22 = btSwapEndian(pbVar9->m_quantizedAabbMax[0]);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_quantizedAabbMax[0] = in_stack_ffffffffffffff22;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      in_stack_ffffffffffffff24 = btSwapEndian(pbVar9->m_quantizedAabbMax[1]);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_quantizedAabbMax[1] = in_stack_ffffffffffffff24;
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      in_stack_ffffffffffffff26 = btSwapEndian(pbVar9->m_quantizedAabbMax[2]);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_quantizedAabbMax[2] = in_stack_ffffffffffffff26;
      btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      uVar5 = btSwapEndian(0);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_rootNodeIndex = uVar5;
      btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_54);
      uVar5 = btSwapEndian(0);
      pbVar9 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RSI + 0x1a),local_54);
      pbVar9->m_subtreeSize = uVar5;
    }
  }
  btAlignedObjectArray<btBvhSubtreeInfo>::initializeFromBuffer
            ((btAlignedObjectArray<btBvhSubtreeInfo> *)
             CONCAT26(in_stack_ffffffffffffff26,
                      CONCAT24(in_stack_ffffffffffffff24,
                               CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (void *)CONCAT26(in_stack_ffffffffffffff1e,
                              CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
             in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  *in_RSI = 0;
  return true;
}

Assistant:

bool btQuantizedBvh::serialize(void *o_alignedDataBuffer, unsigned /*i_dataBufferSize */, bool i_swapEndian) const
{
	btAssert(m_subtreeHeaderCount == m_SubtreeHeaders.size());
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

/*	if (i_dataBufferSize < calculateSerializeBufferSize() || o_alignedDataBuffer == NULL || (((unsigned)o_alignedDataBuffer & BVH_ALIGNMENT_MASK) != 0))
	{
		///check alignedment for buffer?
		btAssert(0);
		return false;
	}
*/

	btQuantizedBvh *targetBvh = (btQuantizedBvh *)o_alignedDataBuffer;

	// construct the class so the virtual function table, etc will be set up
	// Also, m_leafNodes and m_quantizedLeafNodes will be initialized to default values by the constructor
	new (targetBvh) btQuantizedBvh;

	if (i_swapEndian)
	{
		targetBvh->m_curNodeIndex = static_cast<int>(btSwapEndian(m_curNodeIndex));


		btSwapVector3Endian(m_bvhAabbMin,targetBvh->m_bvhAabbMin);
		btSwapVector3Endian(m_bvhAabbMax,targetBvh->m_bvhAabbMax);
		btSwapVector3Endian(m_bvhQuantization,targetBvh->m_bvhQuantization);

		targetBvh->m_traversalMode = (btTraversalMode)btSwapEndian(m_traversalMode);
		targetBvh->m_subtreeHeaderCount = static_cast<int>(btSwapEndian(m_subtreeHeaderCount));
	}
	else
	{
		targetBvh->m_curNodeIndex = m_curNodeIndex;
		targetBvh->m_bvhAabbMin = m_bvhAabbMin;
		targetBvh->m_bvhAabbMax = m_bvhAabbMax;
		targetBvh->m_bvhQuantization = m_bvhQuantization;
		targetBvh->m_traversalMode = m_traversalMode;
		targetBvh->m_subtreeHeaderCount = m_subtreeHeaderCount;
	}

	targetBvh->m_useQuantization = m_useQuantization;

	unsigned char *nodeData = (unsigned char *)targetBvh;
	nodeData += sizeof(btQuantizedBvh);
	
	unsigned sizeToAdd = 0;//(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;
	
	int nodeCount = m_curNodeIndex;

	if (m_useQuantization)
	{
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = static_cast<int>(btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
	
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex;


			}
		}
		nodeData += sizeof(btQuantizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}
	else
	{
		targetBvh->m_contiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				btSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMinOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg);
				btSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMaxOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg);

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_escapeIndex));
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_subPart));
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_triangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg = m_contiguousNodes[nodeIndex].m_aabbMinOrg;
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg = m_contiguousNodes[nodeIndex].m_aabbMaxOrg;

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = m_contiguousNodes[nodeIndex].m_escapeIndex;
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = m_contiguousNodes[nodeIndex].m_subPart;
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = m_contiguousNodes[nodeIndex].m_triangleIndex;
			}
		}
		nodeData += sizeof(btOptimizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_contiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}

	sizeToAdd = 0;//(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	// Now serialize the subtree headers
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(nodeData, m_subtreeHeaderCount, m_subtreeHeaderCount);
	if (i_swapEndian)
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = static_cast<int>(btSwapEndian(m_SubtreeHeaders[i].m_rootNodeIndex));
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = static_cast<int>(btSwapEndian(m_SubtreeHeaders[i].m_subtreeSize));
		}
	}
	else
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = (m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = (m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = (m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = (m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = (m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = (m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = (m_SubtreeHeaders[i].m_rootNodeIndex);
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = (m_SubtreeHeaders[i].m_subtreeSize);

			// need to clear padding in destination buffer
			targetBvh->m_SubtreeHeaders[i].m_padding[0] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[1] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[2] = 0;
		}
	}
	nodeData += sizeof(btBvhSubtreeInfo) * m_subtreeHeaderCount;

	// this clears the pointer in the member variable it doesn't really do anything to the data
	// it does call the destructor on the contained objects, but they are all classes with no destructor defined
	// so the memory (which is not freed) is left alone
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(NULL, 0, 0);

	// this wipes the virtual function table pointer at the start of the buffer for the class
	*((void**)o_alignedDataBuffer) = NULL;

	return true;
}